

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

uint __thiscall ON_PointCloud::HiddenPointUnsignedCount(ON_PointCloud *this)

{
  uint uVar1;
  uint uVar2;
  uint point_count;
  ON_PointCloud *this_local;
  
  if ((((this->m_hidden_count != 0) &&
       (uVar1 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                          (&(this->m_P).super_ON_SimpleArray<ON_3dPoint>), uVar1 != 0)) &&
      (this->m_hidden_count <= uVar1)) &&
     (uVar2 = ON_SimpleArray<bool>::UnsignedCount(&this->m_H), uVar2 == uVar1)) {
    return this->m_hidden_count;
  }
  return 0;
}

Assistant:

unsigned int ON_PointCloud::HiddenPointUnsignedCount() const
{
  unsigned int point_count;
  return (    m_hidden_count > 0 
           && (point_count = m_P.UnsignedCount()) > 0
           && m_hidden_count <= point_count 
           && m_H.UnsignedCount() == point_count 
           )
           ? m_hidden_count
           : 0;
}